

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# price_update_decoder.cpp
# Opt level: O0

PriceField __thiscall
bidfx_public_api::price::pixie::PriceUpdateDecoder::DecodeAsInteger
          (PriceUpdateDecoder *this,ByteBuffer *buffer,FieldDef *field_def)

{
  int16_t iVar1;
  uint uVar2;
  int32_t iVar3;
  uint32_t uVar4;
  int value;
  int64_t iVar5;
  uint64_t uVar6;
  anon_union_8_4_08ebdfac_for_PriceField_2 extraout_RDX;
  anon_union_8_4_08ebdfac_for_PriceField_2 extraout_RDX_00;
  anon_union_8_4_08ebdfac_for_PriceField_2 extraout_RDX_01;
  anon_union_8_4_08ebdfac_for_PriceField_2 extraout_RDX_02;
  anon_union_8_4_08ebdfac_for_PriceField_2 extraout_RDX_03;
  anon_union_8_4_08ebdfac_for_PriceField_2 extraout_RDX_04;
  anon_union_8_4_08ebdfac_for_PriceField_2 extraout_RDX_05;
  anon_union_8_4_08ebdfac_for_PriceField_2 extraout_RDX_06;
  anon_union_8_4_08ebdfac_for_PriceField_2 aVar7;
  PriceField PVar8;
  FieldDef *field_def_local;
  ByteBuffer *buffer_local;
  
  switch(field_def->encoding_) {
  case FIXED1:
    uVar2 = (**(buffer->super_InputStream)._vptr_InputStream)();
    PriceField::PriceField((PriceField *)this,uVar2 & 0xff);
    aVar7 = extraout_RDX;
    break;
  case FIXED2:
    iVar1 = tools::ByteBuffer::ReadShort(buffer);
    PriceField::PriceField((PriceField *)this,(int)iVar1);
    aVar7 = extraout_RDX_00;
    break;
  case FIXED3:
    iVar3 = tools::ByteBuffer::ReadMedium(buffer);
    PriceField::PriceField((PriceField *)this,iVar3);
    aVar7 = extraout_RDX_01;
    break;
  case FIXED4:
    iVar3 = tools::ByteBuffer::ReadInt(buffer);
    PriceField::PriceField((PriceField *)this,iVar3);
    aVar7 = extraout_RDX_02;
    break;
  default:
    SkipFieldValue(buffer,field_def);
    PriceField::PriceField((PriceField *)this);
    aVar7 = extraout_RDX_06;
    break;
  case FIXED8:
    iVar5 = tools::ByteBuffer::ReadLong(buffer);
    PriceField::PriceField((PriceField *)this,(int32_t)iVar5);
    aVar7 = extraout_RDX_03;
    break;
  case VARINT:
    uVar4 = tools::Varint::ReadU32(&buffer->super_InputStream);
    uVar6 = EncodingUtil::PowerOfTen(field_def->scale_);
    PriceField::PriceField((PriceField *)this,uVar4 * (int)uVar6);
    aVar7 = extraout_RDX_04;
    break;
  case ZIGZAG:
    uVar4 = tools::Varint::ReadU32(&buffer->super_InputStream);
    value = tools::Varint::ZigzagToInt(uVar4);
    PriceField::PriceField((PriceField *)this,value);
    aVar7 = extraout_RDX_05;
  }
  PVar8.field_1.long_value_ = aVar7.long_value_;
  PVar8._0_8_ = this;
  return PVar8;
}

Assistant:

PriceField PriceUpdateDecoder::DecodeAsInteger(ByteBuffer& buffer, FieldDef& field_def)
{
    switch (field_def.encoding_)
    {
        case FIXED1:
            return PriceField((int32_t) buffer.ReadByte());
        case FIXED2:
            return PriceField((int32_t) buffer.ReadShort());
        case FIXED3:
            return PriceField(buffer.ReadMedium());
        case FIXED4:
            return PriceField(buffer.ReadInt());
        case FIXED8:
            return PriceField((int32_t) buffer.ReadLong());
        case VARINT:
            return PriceField((int32_t) tools::Varint::ReadU32(buffer) * (int32_t) EncodingUtil::PowerOfTen(field_def.scale_));
        case ZIGZAG:
            return PriceField(Varint::ZigzagToInt(tools::Varint::ReadU32(buffer)));
    }
    SkipFieldValue(buffer, field_def);
    return PriceField();
}